

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::inputMethodEvent(QLineEdit *this,QInputMethodEvent *e)

{
  QLineEditPrivate *this_00;
  QLineEditPrivate *this_01;
  QLineEditPrivate *d;
  QWidgetLineControl *this_02;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  this_02 = this_00->control;
  if ((((~*(uint *)&this_02->field_0x50 & 0x30) == 0) &&
      ((this_02->m_passwordEchoTimer).m_id == Invalid)) &&
     ((this_02->m_passwordEchoEditing & 1U) == 0)) {
    QLineEditPrivate::updatePasswordEchoEditing(this_00,true);
    this_01 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
    QLineEditPrivate::resetInputMethod(this_01);
    QWidgetLineControl::clear((QWidgetLineControl *)this_01->control);
    this_02 = this_00->control;
  }
  QWidgetLineControl::processInputMethodEvent((QWidgetLineControl *)this_02,e);
  if (*(long *)(e + 0x38) != 0) {
    QWidgetLineControl::complete((QWidgetLineControl *)this_00->control,0x1ffffff);
    return;
  }
  return;
}

Assistant:

void QLineEdit::inputMethodEvent(QInputMethodEvent *e)
{
    Q_D(QLineEdit);

    if (echoMode() == PasswordEchoOnEdit && !d->control->passwordEchoEditing()) {
        // Clear the edit and reset to normal echo mode while entering input
        // method data; the echo mode switches back when the edit loses focus.
        // ### changes a public property, resets current content.
        d->updatePasswordEchoEditing(true);
        clear();
    }

#ifdef QT_KEYPAD_NAVIGATION
    // Focus in if currently in navigation focus on the widget
    // Only focus in on preedits, to allow input methods to
    // commit text as they focus out without interfering with focus
    if (QApplicationPrivate::keypadNavigationEnabled()
        && hasFocus() && !hasEditFocus()
        && !e->preeditString().isEmpty())
        setEditFocus(true);
#endif

    d->control->processInputMethodEvent(e);

#if QT_CONFIG(completer)
    if (!e->commitString().isEmpty())
        d->control->complete(Qt::Key_unknown);
#endif
}